

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
duckdb::
make_uniq_base<duckdb::ParsedExpression,duckdb::CastExpression,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
          (LogicalType *args,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *args_1)

{
  LogicalType *target;
  ParsedExpression *in_RDI;
  LogicalType *in_stack_ffffffffffffff88;
  LogicalType *in_stack_ffffffffffffff90;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this;
  undefined1 try_cast_p;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> child;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  local_48 [9];
  
  child._M_head_impl = in_RDI;
  target = (LogicalType *)operator_new(0x60);
  try_cast_p = (undefined1)((ulong)in_RDI >> 0x38);
  uVar1 = 1;
  LogicalType::LogicalType(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this = local_48;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  unique_ptr(this,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)in_stack_ffffffffffffff88);
  CastExpression::CastExpression
            ((CastExpression *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),target,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)child._M_head_impl,(bool)try_cast_p);
  unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
  unique_ptr<std::default_delete<duckdb::ParsedExpression>,void>
            (this,(pointer)in_stack_ffffffffffffff88);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)0x24005f);
  LogicalType::~LogicalType((LogicalType *)0x240069);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )child._M_head_impl;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}